

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDfsCiMap(Gia_Man_t *p,int *pCi2Lit,Vec_Int_t *vLits)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  long lVar8;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar5;
  p->pObjs->Value = 0;
  for (lVar8 = 0; lVar8 < p->vCis->nSize; lVar8 = lVar8 + 1) {
    pGVar6 = Gia_ManCi(p,(int)lVar8);
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar6->Value = uVar1;
    if (pCi2Lit[lVar8] != -1) {
      iVar2 = Abc_Lit2Var(pCi2Lit[lVar8]);
      pGVar7 = Gia_ManObj(p,iVar2);
      uVar1 = pGVar7->Value;
      iVar2 = Abc_LitIsCompl(pCi2Lit[lVar8]);
      uVar1 = Abc_LitNotCond(uVar1,iVar2);
      pGVar6->Value = uVar1;
    }
  }
  Gia_ManHashAlloc(p_00);
  iVar2 = 0;
  if (vLits == (Vec_Int_t *)0x0) {
    for (; iVar2 < p->vCos->nSize; iVar2 = iVar2 + 1) {
      pGVar6 = Gia_ManCo(p,iVar2);
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      Gia_ManDupDfs2_rec(p_00,p,pGVar6 + -(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff));
      iVar3 = Gia_ObjFanin0Copy(pGVar6);
      Gia_ManAppendCo(p_00,iVar3);
    }
  }
  else {
    for (; iVar2 < vLits->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(vLits,iVar2);
      iVar4 = Abc_Lit2Var(iVar3);
      pGVar6 = Gia_ManObj(p,iVar4);
      iVar4 = Gia_ManDupDfs2_rec(p_00,p,pGVar6);
      iVar3 = Abc_LitIsCompl(iVar3);
      iVar3 = Abc_LitNotCond(iVar4,iVar3);
      Gia_ManAppendCo(p_00,iVar3);
    }
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfsCiMap( Gia_Man_t * p, int * pCi2Lit, Vec_Int_t * vLits )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( ~pCi2Lit[i] )
            pObj->Value = Abc_LitNotCond( Gia_ManObj(p, Abc_Lit2Var(pCi2Lit[i]))->Value, Abc_LitIsCompl(pCi2Lit[i]) );
    }
    Gia_ManHashAlloc( pNew );
    if ( vLits )
    {
        int iLit, iLitRes;
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            iLitRes = Gia_ManDupDfs2_rec( pNew, p, Gia_ManObj(p, Abc_Lit2Var(iLit)) );
            Gia_ManAppendCo( pNew, Abc_LitNotCond( iLitRes, Abc_LitIsCompl(iLit)) );
        }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, i )
        {
            Gia_ManDupDfs2_rec( pNew, p, Gia_ObjFanin0(pObj) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}